

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Access(int g_a,int *lo,int *hi,void *ptr,int *ld)

{
  Integer IVar1;
  long lVar2;
  long g_a_00;
  Integer *ld_00;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer aIStack_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  g_a_00 = (long)g_a;
  IVar1 = pnga_ndim(g_a_00);
  lVar2 = IVar1;
  if (0 < IVar1) {
    do {
      lVar2 = lVar2 + -1;
      local_a8[lVar2] = (long)*lo + 1;
      lo = lo + 1;
    } while (lVar2 != 0);
    lVar2 = IVar1;
    if (0 < IVar1) {
      do {
        lVar2 = lVar2 + -1;
        aIStack_e8[lVar2] = (long)*hi + 1;
        hi = hi + 1;
      } while (lVar2 != 0);
      ld_00 = local_68;
      pnga_access_ptr(g_a_00,local_a8,aIStack_e8,ptr,ld_00);
      for (; IVar1 != 1; IVar1 = IVar1 + -1) {
        ld[IVar1 + -2] = (int)*ld_00;
        ld_00 = ld_00 + 1;
      }
      return;
    }
  }
  pnga_access_ptr(g_a_00,local_a8,aIStack_e8,ptr,local_68);
  return;
}

Assistant:

void NGA_Access(int g_a, int lo[], int hi[], void *ptr, int ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     Integer _ga_work[MAXDIM];
     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);

     wnga_access_ptr(a,_ga_lo, _ga_hi, ptr, _ga_work);
     COPYF2C(_ga_work,ld, ndim-1);
}